

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall TgBot::TgTypeParser::parseJsonAndGetUser(TgTypeParser *this,ptree *data)

{
  type_conflict tVar1;
  int iVar2;
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar3;
  path_type pStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::make_shared<TgBot::User>();
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"id",0x2e);
  iVar2 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<int>(in_RDX,&pStack_68);
  **(int **)this = iVar2;
  std::__cxx11::string::~string((string *)&pStack_68);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"is_bot",0x2e);
  local_38._M_dataplus._M_p._0_1_ = 0;
  tVar1 = boost::property_tree::
          basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::get<bool>(in_RDX,&pStack_68,(bool *)&local_38);
  *(type_conflict *)(*(long *)this + 4) = tVar1;
  std::__cxx11::string::~string((string *)&pStack_68);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"first_name",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&local_38,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&pStack_68);
  std::__cxx11::string::operator=((string *)(*(long *)this + 8),(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&pStack_68);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"last_name",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_38,in_RDX,&pStack_68,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x28),(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&pStack_68);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"username",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_38,in_RDX,&pStack_68,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x48),(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&pStack_68);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&pStack_68,"language_code",0x2e);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::get<char>(&local_38,in_RDX,&pStack_68,"");
  std::__cxx11::string::operator=((string *)(*(long *)this + 0x68),(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&pStack_68);
  PVar3.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar3.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Ptr)PVar3.super___shared_ptr<TgBot::User,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

User::Ptr TgTypeParser::parseJsonAndGetUser(const ptree& data) const {
    auto result(make_shared<User>());
    result->id = data.get<int32_t>("id");
    result->isBot = data.get<bool>("is_bot", false);
    result->firstName = data.get<string>("first_name");
    result->lastName = data.get("last_name", "");
    result->username = data.get("username", "");
    result->languageCode = data.get("language_code", "");
    return result;
}